

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.cc
# Opt level: O3

void __thiscall
MC::MC_Parser::basic_symbol<MC::MC_Parser::by_state>::move
          (basic_symbol<MC::MC_Parser::by_state> *this,basic_symbol<MC::MC_Parser::by_state> *s)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  uint uVar7;
  
  (this->super_by_state).state = (s->super_by_state).state;
  (s->super_by_state).state = '\0';
  uVar6 = (ulong)(this->super_by_state).state;
  if (uVar6 == 0) goto switchD_00148bd6_caseD_13;
  uVar7 = *(ushort *)(yystos_ + uVar6 * 2) - 0x102;
  if ((uVar7 < 0x1d) && ((0x1790498bU >> (uVar7 & 0x1f) & 1) != 0)) {
switchD_00148bd6_caseD_14:
    value_type::move<int>(&this->value,&s->value);
  }
  else {
    switch(*(ushort *)(yystos_ + uVar6 * 2)) {
    case 0x12:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x1b:
      u = value_type::as<std::__cxx11::string>(&s->value);
      value_type::emplace<std::__cxx11::string,std::__cxx11::string>(&this->value,u);
      value_type::destroy<std::__cxx11::string>(&s->value);
      break;
    case 0x14:
    case 0x18:
      goto switchD_00148bd6_caseD_14;
    case 0x19:
      value_type::move<bool>(&this->value,&s->value);
      break;
    case 0x1a:
      value_type::move<float>(&this->value,&s->value);
    }
  }
switchD_00148bd6_caseD_13:
  pfVar1 = (s->location).begin.filename;
  cVar4 = (s->location).begin.line;
  cVar5 = (s->location).begin.column;
  cVar2 = (s->location).end.line;
  cVar3 = (s->location).end.column;
  (this->location).end.filename = (s->location).end.filename;
  (this->location).end.line = cVar2;
  (this->location).end.column = cVar3;
  (this->location).begin.filename = pfVar1;
  (this->location).begin.line = cVar4;
  (this->location).begin.column = cVar5;
  return;
}

Assistant:

void
  MC_Parser::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_BOOL: // BOOL
        value.move< bool > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_APPROXNUM: // APPROXNUM
        value.move< float > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_COMPARISON: // COMPARISON
      case symbol_kind::S_INTNUM: // INTNUM
      case symbol_kind::S_column_list: // column_list
      case symbol_kind::S_select_expr_list: // select_expr_list
      case symbol_kind::S_table_references: // table_references
      case symbol_kind::S_delete_opts: // delete_opts
      case symbol_kind::S_delete_list: // delete_list
      case symbol_kind::S_insert_opts: // insert_opts
      case symbol_kind::S_insert_vals_list: // insert_vals_list
      case symbol_kind::S_create_col_list: // create_col_list
      case symbol_kind::S_column_atts: // column_atts
      case symbol_kind::S_opt_length: // opt_length
      case symbol_kind::S_opt_binary: // opt_binary
      case symbol_kind::S_opt_uz: // opt_uz
      case symbol_kind::S_data_type: // data_type
        value.move< int > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_WORD: // WORD
      case symbol_kind::S_HLH: // HLH
      case symbol_kind::S_NAME: // NAME
      case symbol_kind::S_STRING: // STRING
      case symbol_kind::S_USERVAR: // USERVAR
        value.move< std::string > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }